

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O1

size_t unescape(char *out,char *in,size_t len)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  
  pbVar3 = (byte *)out;
  if (len != 0) {
    uVar5 = 0;
    do {
      bVar1 = in[uVar5];
      uVar4 = uVar5;
      bVar2 = bVar1;
      if (bVar1 == 0x5c) {
        uVar4 = uVar5 + 1;
        bVar2 = in[uVar5 + 1];
        if (bVar2 < 0x66) {
          if ((bVar2 != 0x22) && (bVar2 != 0x5c)) {
            if (bVar2 != 0x62) goto LAB_0010cd92;
            bVar2 = 8;
          }
        }
        else if (bVar2 < 0x72) {
          if (bVar2 == 0x66) {
            bVar2 = 0xc;
          }
          else if (bVar2 == 0x6e) {
            bVar2 = 10;
          }
          else {
LAB_0010cd92:
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                    ,0xce,"Unsupported escape sequence \\%c\n",(ulong)(uint)(int)(char)bVar2);
            uVar4 = uVar5;
            bVar2 = bVar1;
          }
        }
        else if (bVar2 == 0x72) {
          bVar2 = 0xd;
        }
        else {
          if (bVar2 != 0x74) goto LAB_0010cd92;
          bVar2 = 9;
        }
      }
      *pbVar3 = bVar2;
      pbVar3 = pbVar3 + 1;
      uVar5 = uVar4 + 1;
    } while (uVar5 < len);
  }
  *pbVar3 = 0;
  return (long)pbVar3 - (long)out;
}

Assistant:

size_t
unescape(char *out, const char *in, size_t len)
{
   char *ptr = out;
   size_t i;

   for (i = 0; i < len; ++i) {
      int c = in[i];
      if (c == '\\') {
          switch (in[i+1]) {
          case '"':  *ptr++ = '"'; i++; break;
          case '\\': *ptr++ = '\\'; i++; break;
          case 'b':  *ptr++ = '\b'; i++; break;
          case 'f':  *ptr++ = '\f'; i++; break;
          case 'n': *ptr++ = '\n'; i++; break;
          case 'r': *ptr++ = '\r'; i++; break;
          case 't': *ptr++ = '\t'; i++; break;
          default:
              E_WARN("Unsupported escape sequence \\%c\n", in[i+1]);
              *ptr++ = c;
          }
      }
      else {
          *ptr++ = c;
      }
   }
   *ptr = '\0';
   return ptr - out;
}